

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

void opengv::absolute_pose::modules::gpnp3::compute
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix)

{
  int in_stack_0000001c;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_00000020;
  int in_stack_0000002c;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_00000030;
  int in_stack_0000003c;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_00000040;
  int in_stack_0000004c;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_00000050;
  int in_stack_0000005c;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_00000060;
  int in_stack_0000006c;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_00000070;
  int in_stack_0000007c;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_00000080;
  int in_stack_0000008c;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_00000090;
  int in_stack_0000009c;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_000000a0;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_000000b0;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_000000d0;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_000000e0;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_00000100;
  Matrix<double,_15,_18,_0,_15,_18> *in_stack_00000110;
  
  sPolynomial4(in_stack_00000110);
  sPolynomial5(in_stack_00000110);
  groebnerRow4_000_f(in_stack_00000090,in_stack_0000008c);
  sPolynomial6(in_stack_00000110);
  groebnerRow4_000_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow5_000_f(in_stack_00000080,in_stack_0000007c);
  sPolynomial7(in_stack_000000d0);
  groebnerRow5_100_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow6_100_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow4_000_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow5_000_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow6_000_f(in_stack_00000070,in_stack_0000006c);
  sPolynomial8(in_stack_000000e0);
  groebnerRow4_100_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow5_100_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow6_100_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow7_000_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow3_000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow4_000_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow5_000_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow6_000_f(in_stack_00000070,in_stack_0000006c);
  sPolynomial9(in_stack_000000e0);
  groebnerRow5_010_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow3_100_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow4_100_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow5_100_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow6_100_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow7_000_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow8_000_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow3_000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow4_000_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow5_000_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow6_000_f(in_stack_00000070,in_stack_0000006c);
  sPolynomial10(in_stack_00000100);
  groebnerRow4_010_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow5_010_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow3_100_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow4_100_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow5_100_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow6_100_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow9_100_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow8_000_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow3_000_f(in_stack_000000a0,in_stack_0000009c);
  groebnerRow4_000_f(in_stack_00000090,in_stack_0000008c);
  groebnerRow5_000_f(in_stack_00000080,in_stack_0000007c);
  groebnerRow6_000_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow9_000_f(in_stack_00000060,in_stack_0000005c);
  sPolynomial11(in_stack_00000090);
  groebnerRow6_000_f(in_stack_00000070,in_stack_0000006c);
  groebnerRow9_000_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow10_000_f(in_stack_00000050,in_stack_0000004c);
  sPolynomial12(in_stack_000000b0);
  groebnerRow10_100_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow11_100_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow9_000_f(in_stack_00000060,in_stack_0000005c);
  groebnerRow10_000_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow11_000_f(in_stack_00000040,in_stack_0000003c);
  sPolynomial13(in_stack_00000080);
  groebnerRow10_100_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow11_010_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow12_010_f(in_stack_00000030,in_stack_0000002c);
  groebnerRow11_100_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow12_100_f(in_stack_00000030,in_stack_0000002c);
  groebnerRow10_000_f(in_stack_00000050,in_stack_0000004c);
  groebnerRow11_000_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow12_000_f(in_stack_00000030,in_stack_0000002c);
  sPolynomial14(in_stack_00000040);
  groebnerRow11_000_f(in_stack_00000040,in_stack_0000003c);
  groebnerRow12_000_f(in_stack_00000030,in_stack_0000002c);
  groebnerRow13_000_f(in_stack_00000020,in_stack_0000001c);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::compute(
    Eigen::Matrix<double,15,18> & groebnerMatrix )
{
  sPolynomial4(groebnerMatrix);

  sPolynomial5(groebnerMatrix);
  groebnerRow4_000_f(groebnerMatrix,5);

  sPolynomial6(groebnerMatrix);
  groebnerRow4_000_f(groebnerMatrix,6);
  groebnerRow5_000_f(groebnerMatrix,6);

  sPolynomial7(groebnerMatrix);
  groebnerRow5_100_f(groebnerMatrix,7);
  groebnerRow6_100_f(groebnerMatrix,7);
  groebnerRow4_000_f(groebnerMatrix,7);
  groebnerRow5_000_f(groebnerMatrix,7);
  groebnerRow6_000_f(groebnerMatrix,7);

  sPolynomial8(groebnerMatrix);
  groebnerRow4_100_f(groebnerMatrix,8);
  groebnerRow5_100_f(groebnerMatrix,8);
  groebnerRow6_100_f(groebnerMatrix,8);
  groebnerRow7_000_f(groebnerMatrix,8);
  groebnerRow3_000_f(groebnerMatrix,8);
  groebnerRow4_000_f(groebnerMatrix,8);
  groebnerRow5_000_f(groebnerMatrix,8);
  groebnerRow6_000_f(groebnerMatrix,8);

  sPolynomial9(groebnerMatrix);
  groebnerRow5_010_f(groebnerMatrix,9);
  groebnerRow3_100_f(groebnerMatrix,9);
  groebnerRow4_100_f(groebnerMatrix,9);
  groebnerRow5_100_f(groebnerMatrix,9);
  groebnerRow6_100_f(groebnerMatrix,9);
  groebnerRow7_000_f(groebnerMatrix,9);
  groebnerRow8_000_f(groebnerMatrix,9);
  groebnerRow3_000_f(groebnerMatrix,9);
  groebnerRow4_000_f(groebnerMatrix,9);
  groebnerRow5_000_f(groebnerMatrix,9);
  groebnerRow6_000_f(groebnerMatrix,9);

  sPolynomial10(groebnerMatrix);
  groebnerRow4_010_f(groebnerMatrix,10);
  groebnerRow5_010_f(groebnerMatrix,10);
  groebnerRow3_100_f(groebnerMatrix,10);
  groebnerRow4_100_f(groebnerMatrix,10);
  groebnerRow5_100_f(groebnerMatrix,10);
  groebnerRow6_100_f(groebnerMatrix,10);
  groebnerRow9_100_f(groebnerMatrix,10);
  groebnerRow8_000_f(groebnerMatrix,10);
  groebnerRow3_000_f(groebnerMatrix,10);
  groebnerRow4_000_f(groebnerMatrix,10);
  groebnerRow5_000_f(groebnerMatrix,10);
  groebnerRow6_000_f(groebnerMatrix,10);
  groebnerRow9_000_f(groebnerMatrix,10);

  sPolynomial11(groebnerMatrix);
  groebnerRow6_000_f(groebnerMatrix,11);
  groebnerRow9_000_f(groebnerMatrix,11);
  groebnerRow10_000_f(groebnerMatrix,11);

  sPolynomial12(groebnerMatrix);
  groebnerRow10_100_f(groebnerMatrix,12);
  groebnerRow11_100_f(groebnerMatrix,12);
  groebnerRow9_000_f(groebnerMatrix,12);
  groebnerRow10_000_f(groebnerMatrix,12);
  groebnerRow11_000_f(groebnerMatrix,12);

  sPolynomial13(groebnerMatrix);
  groebnerRow10_100_f(groebnerMatrix,13);
  groebnerRow11_010_f(groebnerMatrix,13);
  groebnerRow12_010_f(groebnerMatrix,13);
  groebnerRow11_100_f(groebnerMatrix,13);
  groebnerRow12_100_f(groebnerMatrix,13);
  groebnerRow10_000_f(groebnerMatrix,13);
  groebnerRow11_000_f(groebnerMatrix,13);
  groebnerRow12_000_f(groebnerMatrix,13);

  sPolynomial14(groebnerMatrix);
  groebnerRow11_000_f(groebnerMatrix,14);
  groebnerRow12_000_f(groebnerMatrix,14);
  groebnerRow13_000_f(groebnerMatrix,14);

}